

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen8CachePolicy.cpp
# Opt level: O3

uint32_t __thiscall
GmmLib::GmmGen8CachePolicy::BestMatchingPATIdx
          (GmmGen8CachePolicy *this,GMM_CACHE_POLICY_ELEMENT CachePolicy)

{
  GMM_GFX_MEMORY_TYPE GVar1;
  Context *pCVar2;
  GMM_CACHE_POLICY_ELEMENT CachePolicy_00;
  undefined1 auVar3 [32];
  uint uVar4;
  GMM_GFX_MEMORY_TYPE GVar5;
  uint32_t uVar6;
  GMM_GFX_MEMORY_TYPE GVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  GMM_GFX_MEMORY_TYPE GVar12;
  bool bVar13;
  GMM_GFX_MEMORY_TYPE GVar14;
  undefined8 in_stack_ffffffffffffffd0;
  
  auVar3 = CachePolicy._8_32_;
  CachePolicy_00._32_8_ = in_stack_ffffffffffffffd0;
  CachePolicy_00.IDCode = auVar3._0_4_;
  CachePolicy_00._4_4_ = auVar3._4_4_;
  CachePolicy_00.field_1 = (anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1)auVar3._8_8_;
  CachePolicy_00.MemoryObjectOverride = (MEMORY_OBJECT_CONTROL_STATE)auVar3._16_4_;
  CachePolicy_00.field_3 = (anon_union_4_2_78ef2503_for_GMM_CACHE_POLICY_ELEMENT_REC_4)auVar3._20_4_
  ;
  CachePolicy_00.PTE = (GMM_PTE_CACHE_CONTROL_BITS)auVar3._24_8_;
  GVar5 = GmmCachePolicyCommon::GetWantedMemoryType
                    (&this->super_GmmCachePolicyCommon,CachePolicy_00);
  uVar9 = 1;
  if (((undefined1  [40])CachePolicy & (undefined1  [40])0x1) == (undefined1  [40])0x0) {
    uVar9 = (uint)(((undefined1  [40])CachePolicy & (undefined1  [40])0x2) == (undefined1  [40])0x0)
            * 3;
  }
  uVar8 = 3;
  if ((~CachePolicy.field_1._0_4_ & 3) != 0) {
    uVar8 = uVar9;
  }
  uVar9 = (this->super_GmmCachePolicyCommon).NumPATRegisters;
  GVar7 = GMM_GFX_UC_WITH_FENCE;
  uVar11 = 0;
  if (1 < (ulong)uVar9) {
    pCVar2 = (this->super_GmmCachePolicyCommon).pGmmLibContext;
    lVar10 = 0;
    uVar11 = 0;
    do {
      GVar12 = GMM_GFX_UC_WITH_FENCE;
      if (uVar11 < uVar9) {
        GVar12 = pCVar2->PrivatePATTable[uVar11].Value;
      }
      GVar1 = pCVar2->PrivatePATTable[lVar10 + 1].Value;
      GVar14 = GVar1 & GMM_GFX_WB;
      if ((GVar12 & GMM_GFX_WB) == GVar5) {
        bVar13 = ((GVar1 >> 2 & 3) == uVar8 && GVar14 == GVar5) && uVar8 != (GVar12 >> 2 & 3);
      }
      else {
        bVar13 = GVar14 == GMM_GFX_UC_WITH_FENCE || GVar14 == GVar5;
      }
      lVar10 = lVar10 + 1;
      uVar4 = (uint)lVar10;
      if (!bVar13) {
        uVar4 = uVar11;
      }
      uVar11 = uVar4;
    } while ((ulong)uVar9 - 1 != lVar10);
  }
  if (uVar11 < uVar9) {
    GVar7 = ((this->super_GmmCachePolicyCommon).pGmmLibContext)->PrivatePATTable[uVar11].Value &
            GMM_GFX_WB;
  }
  uVar6 = 0xffffffff;
  if (GVar7 == GVar5) {
    uVar6 = uVar11;
  }
  return uVar6;
}

Assistant:

uint32_t GmmLib::GmmGen8CachePolicy::BestMatchingPATIdx(GMM_CACHE_POLICY_ELEMENT CachePolicy)
{
    uint32_t             i;
    uint32_t             PATIdx           = 0;
    GMM_GFX_MEMORY_TYPE  WantedMemoryType = GMM_GFX_UC_WITH_FENCE, MemoryType;
    GMM_GFX_TARGET_CACHE WantedTC         = GMM_GFX_TC_ELLC_LLC;

    WantedMemoryType = GetWantedMemoryType(CachePolicy);

    if(CachePolicy.LLC && CachePolicy.ELLC)
    {
        WantedTC = GMM_GFX_TC_ELLC_LLC;
    }
    else if(CachePolicy.LLC)
    {
        WantedTC = GMM_GFX_TC_LLC_ONLY;
    }
    else if(CachePolicy.ELLC)
    {
        WantedTC = GMM_GFX_TC_ELLC_ONLY; // Note: this overrides the MOCS target cache selection.
    }

    for(i = 1; i < NumPATRegisters; i++)
    {
        GMM_PRIVATE_PAT PAT1 = GetPrivatePATEntry(PATIdx);
        GMM_PRIVATE_PAT PAT2 = GetPrivatePATEntry(i);

        if(SelectNewPATIdx(WantedMemoryType, WantedTC,
                           (GMM_GFX_MEMORY_TYPE)PAT1.PreGen10.MemoryType, (GMM_GFX_TARGET_CACHE)PAT1.PreGen10.TargetCache,
                           (GMM_GFX_MEMORY_TYPE)PAT2.PreGen10.MemoryType, (GMM_GFX_TARGET_CACHE)PAT2.PreGen10.TargetCache))
        {
            PATIdx = i;
        }
    }

    MemoryType = (GMM_GFX_MEMORY_TYPE)GetPrivatePATEntry(PATIdx).PreGen10.MemoryType;

    if(MemoryType != WantedMemoryType)
    {
        // Failed to find a matching PAT entry
        return GMM_PAT_ERROR;
    }
    return PATIdx;
}